

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<std::nullopt_t,std::optional<int>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,nullopt_t *expected,optional<int> *actual)

{
  nullopt_t *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  nullopt_t *local_30;
  optional<int> *actual_local;
  nullopt_t *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = expected;
  actual_local = (optional<int> *)actual_str;
  expected_local = (nullopt_t *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<std::optional<int>,std::nullopt_t>
                    ((optional<int> *)expected,(nullopt_t *)actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<std::nullopt_t,std::optional<int>>
              (&local_50,(internal *)actual_local,local_30,(optional<int> *)actual_str);
    FormatForComparisonFailureMessage<std::optional<int>,std::nullopt_t>
              (&local_70,(internal *)local_30,actual_local,(nullopt_t *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }